

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockComparatorCopierTest_installCopiersWorksHierarchically_TestShell::createTest
          (TEST_MockComparatorCopierTest_installCopiersWorksHierarchically_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                                  ,0x229);
  TEST_MockComparatorCopierTest_installCopiersWorksHierarchically_Test::
  TEST_MockComparatorCopierTest_installCopiersWorksHierarchically_Test
            ((TEST_MockComparatorCopierTest_installCopiersWorksHierarchically_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockComparatorCopierTest, installCopiersWorksHierarchically)
{
    MyTypeForTesting object(1);
    MyTypeForTestingCopier copier;

    mock("existing");
    mock().installCopier("MyTypeForTesting", copier);
    mock("existing").expectOneCall("function").withOutputParameterOfTypeReturning("MyTypeForTesting", "parameterName", &object);
    mock("existing").actualCall("function").withOutputParameterOfType("MyTypeForTesting", "parameterName", &object);

    mock().checkExpectations();
    mock().removeAllComparatorsAndCopiers();
}